

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

value_type __thiscall djb::merl::eval(merl *this,vec3 *wi,vec3 *wo,void *param_3)

{
  int iVar1;
  int iVar2;
  int iVar3;
  const_reference pvVar4;
  float_t *__p;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *extraout_RDX_01;
  float *pfVar5;
  value_type vVar6;
  undefined1 local_70 [8];
  vec3 rgb;
  int idx_b;
  int idx_g;
  int idx_r;
  float_t pd;
  float_t td;
  float_t ph;
  float_t th;
  vec3 wd;
  vec3 wh;
  void *param_3_local;
  vec3 *wo_local;
  vec3 *wi_local;
  merl *this_local;
  
  if ((wo->z <= 0.0) || (*(float *)((long)param_3 + 8) <= 0.0)) {
    (**(code **)(*(long *)wi + 0x10))(this);
    pfVar5 = extraout_RDX_01;
  }
  else {
    vec3::vec3((vec3 *)&wd.y,0.0);
    vec3::vec3((vec3 *)&ph,0.0);
    brdf::io_to_hd(wo,(vec3 *)param_3,(vec3 *)&wd.y,(vec3 *)&ph);
    xyz_to_theta_phi((vec3 *)&wd.y,&td,&pd);
    xyz_to_theta_phi((vec3 *)&ph,(float_t *)&idx_r,(float_t *)&idx_g);
    iVar1 = phi_diff_index((float_t)idx_g);
    iVar2 = theta_diff_index((float_t)idx_r);
    iVar3 = theta_half_index(td);
    iVar1 = iVar1 + (iVar2 * 0x168) / 2 + ((iVar3 * 0x168) / 2) * 0x5a;
    rgb.z = (float_t)(iVar1 + 0x163f50);
    rgb.y = (float_t)(iVar1 + 0x2c7ea0);
    vec3::vec3((vec3 *)local_70,0.0);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&wi->z,(long)iVar1);
    local_70._0_4_ = (undefined4)(*pvVar4 * 0.0006666666666666666);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&wi->z,(long)(int)rgb.z);
    local_70._4_4_ = (undefined4)(*pvVar4 * 0.0007666666666666666);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&wi->z,(long)(int)rgb.y);
    rgb.x = (float_t)(*pvVar4 * 0.0011066666666666666);
    if ((((float)local_70._0_4_ < 0.0) || ((float)local_70._4_4_ < 0.0)) || (rgb.x < 0.0)) {
      fprintf(_stdout,"djb_verbose: below horizon\n");
      (**(code **)(*(long *)wi + 0x10))(this);
      pfVar5 = extraout_RDX;
    }
    else {
      operator*=((vec3 *)local_70,*(float_t *)((long)param_3 + 8));
      __p = vec3::operator[]((vec3 *)local_70,0);
      std::valarray<float>::valarray((valarray<float> *)this,__p,3);
      pfVar5 = extraout_RDX_00;
    }
  }
  vVar6._M_data = pfVar5;
  vVar6._M_size = (size_t)this;
  return vVar6;
}

Assistant:

brdf::value_type merl::eval(const vec3 &wi, const vec3 &wo, const void *) const
{
	if (wi.z > 0 && wo.z > 0) {
		// convert to half / diff angle coordinates
		vec3 wh, wd;
		float_t th, ph, td, pd;
		io_to_hd(wi, wo, &wh, &wd);
		xyz_to_theta_phi(wh, &th, &ph);
		xyz_to_theta_phi(wd, &td, &pd);

		// compute indexes
		int idx_r = phi_diff_index(pd)
		          + theta_diff_index(td)
		          * MERL_SAMPLING_RES_PHI_D / 2
		          + theta_half_index(th)
		          * MERL_SAMPLING_RES_PHI_D / 2
		          * MERL_SAMPLING_RES_THETA_D;
		int idx_g = idx_r + MERL_SAMPLING_RES_THETA_H
		          * MERL_SAMPLING_RES_THETA_D
		          * MERL_SAMPLING_RES_PHI_D / 2;
		int idx_b = idx_r + MERL_SAMPLING_RES_THETA_H
		          * MERL_SAMPLING_RES_THETA_D
		          * MERL_SAMPLING_RES_PHI_D;

		// get color
		vec3 rgb;
		rgb.x = m_samples[idx_r] * MERL_RED_SCALE;
		rgb.y = m_samples[idx_g] * MERL_GREEN_SCALE;
		rgb.z = m_samples[idx_b] * MERL_BLUE_SCALE;

		if (rgb.x < 0 || rgb.y < 0 || rgb.z < 0) {
#ifndef NVERBOSE
			DJB_LOG("djb_verbose: below horizon\n");
#endif
			return zero_value();
		}
		rgb*= wo.z;

		return brdf::value_type(&rgb[0], 3);
	}

	return zero_value();
}